

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void lyht_free(ly_ht *ht,_func_void_void_ptr *val_free)

{
  int *piVar1;
  uint32_t uVar2;
  uchar *puVar3;
  ulong uVar4;
  
  if (ht != (ly_ht *)0x0) {
    if ((val_free != (_func_void_void_ptr *)0x0) && (ht->size != 0)) {
      uVar4 = 0;
      do {
        uVar2 = ht->hlists[uVar4].first;
        if (uVar2 != 0xffffffff) {
          puVar3 = ht->recs + uVar2 * ht->rec_size;
          do {
            (*val_free)(puVar3 + 8);
            piVar1 = (int *)(puVar3 + 4);
            puVar3 = ht->recs + (uint)ht->rec_size * *piVar1;
          } while (*piVar1 != -1);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < ht->size);
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
    return;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyht_free(struct ly_ht *ht, void (*val_free)(void *val_p))
{
    struct ly_ht_rec *rec;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    if (!ht) {
        return;
    }

    if (val_free) {
        LYHT_ITER_ALL_RECS(ht, hlist_idx, rec_idx, rec) {
            val_free(&rec->val);
        }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
}